

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::RenderPassCreateInfo::RenderPassCreateInfo
          (RenderPassCreateInfo *this,deUint32 _attachmentCount,
          VkAttachmentDescription *_pAttachments,deUint32 _subpassCount,
          VkSubpassDescription *_pSubpasses,deUint32 _dependencyCount,
          VkSubpassDependency *_pDependiences)

{
  pointer pSVar1;
  pointer pVVar2;
  pointer pVVar3;
  pointer pVVar4;
  deUint32 dVar5;
  allocator_type local_89;
  vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_> local_88;
  deUint32 local_6c;
  vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_> *local_68;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *local_60;
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> *local_58;
  vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_> *local_50;
  vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_> local_48;
  
  local_50 = &this->m_dependiences;
  local_58 = &this->m_attachmentsStructs;
  local_60 = &this->m_subpassesStructs;
  local_68 = &this->m_dependiencesStructs;
  local_6c = _dependencyCount;
  memset(&this->m_attachments,0,0x90);
  std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>::
  vector<vk::VkAttachmentDescription_const*,void>
            ((vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>
              *)&local_88,_pAttachments,_pAttachments + _attachmentCount,(allocator_type *)&local_48
            );
  std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
  _M_move_assign(&this->m_attachments,&local_88);
  if (local_88.
      super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>>::
  vector<vk::VkSubpassDescription_const*,void>
            ((vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>> *)
             &local_48,_pSubpasses,_pSubpasses + _subpassCount,&local_89);
  local_88.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->m_subpasses).
       super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->m_subpasses).
       super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_subpasses).
       super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_subpasses).
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_subpasses).
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_subpasses).
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::
  ~vector(&local_88);
  std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::
  ~vector(&local_48);
  std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>::
  vector<vk::VkSubpassDependency_const*,void>
            ((vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>> *)
             &local_88,_pDependiences,_pDependiences + local_6c,(allocator_type *)&local_48);
  std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
  _M_move_assign(local_50,&local_88);
  if (local_88.
      super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::AttachmentDescription*,std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>>,void>
            ((vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>> *)
             &local_88,
             (this->m_attachments).
             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_attachments).
             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_48);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
  _M_move_assign(local_58,&local_88);
  if (local_88.
      super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDescription*,std::vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>>>,void>
            ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)&local_88,
             (this->m_subpasses).
             super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_subpasses).
             super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_48);
  std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::_M_move_assign
            (local_60,&local_88);
  if (local_88.
      super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDependency*,std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>>,void>
            ((vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>> *)&local_88,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_48);
  std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::_M_move_assign
            (local_68,&local_88);
  if (local_88.
      super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_VkRenderPassCreateInfo).sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  pVVar2 = (pointer)0x0;
  (this->super_VkRenderPassCreateInfo).pNext = (void *)0x0;
  (this->super_VkRenderPassCreateInfo).flags = 0;
  pSVar1 = (this->m_subpasses).
           super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  dVar5 = (int)((ulong)((long)(this->m_attachments).
                              super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_attachments).
                             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39;
  (this->super_VkRenderPassCreateInfo).attachmentCount = dVar5;
  pVVar4 = (pointer)0x0;
  if (dVar5 != 0) {
    pVVar4 = (this->m_attachmentsStructs).
             super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  (this->super_VkRenderPassCreateInfo).pAttachments = pVVar4;
  dVar5 = (int)((ulong)((long)pSVar1 -
                       (long)(this->m_subpasses).
                             super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x45d1745d;
  (this->super_VkRenderPassCreateInfo).subpassCount = dVar5;
  pVVar3 = (pointer)0x0;
  if (dVar5 != 0) {
    pVVar3 = (this->m_subpassesStructs).
             super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  (this->super_VkRenderPassCreateInfo).pSubpasses = pVVar3;
  dVar5 = (int)((ulong)((long)(this->m_dependiences).
                              super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_dependiences).
                             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x49249249;
  (this->super_VkRenderPassCreateInfo).dependencyCount = dVar5;
  if (dVar5 != 0) {
    pVVar2 = (this->m_dependiencesStructs).
             super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  (this->super_VkRenderPassCreateInfo).pDependencies = pVVar2;
  return;
}

Assistant:

RenderPassCreateInfo::RenderPassCreateInfo (deUint32							_attachmentCount,
											const vk::VkAttachmentDescription*	_pAttachments,
											deUint32							_subpassCount,
											const vk::VkSubpassDescription*		_pSubpasses,
											deUint32							_dependencyCount,
											const vk::VkSubpassDependency*		_pDependiences)
{

	m_attachments	= std::vector<AttachmentDescription>(_pAttachments, _pAttachments + _attachmentCount);
	m_subpasses		= std::vector<SubpassDescription>(_pSubpasses, _pSubpasses + _subpassCount);
	m_dependiences	= std::vector<SubpassDependency>(_pDependiences, _pDependiences + _dependencyCount);

	m_attachmentsStructs	= std::vector<vk::VkAttachmentDescription>	(m_attachments.begin(),		m_attachments.end());
	m_subpassesStructs		= std::vector<vk::VkSubpassDescription>		(m_subpasses.begin(),		m_subpasses.end());
	m_dependiencesStructs	= std::vector<vk::VkSubpassDependency>		(m_dependiences.begin(),	m_dependiences.end());

	sType = vk::VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
	pNext = DE_NULL;
	flags = 0;

	attachmentCount = static_cast<deUint32>(m_attachments.size());

	if (attachmentCount) {
		pAttachments = &m_attachmentsStructs[0];
	}
	else
	{
		pAttachments = DE_NULL;
	}

	subpassCount = static_cast<deUint32>(m_subpasses.size());

	if (subpassCount) {
		pSubpasses = &m_subpassesStructs[0];
	}
	else
	{
		pSubpasses = DE_NULL;
	}

	dependencyCount = static_cast<deUint32>(m_dependiences.size());

	if (dependencyCount) {
		pDependencies = &m_dependiencesStructs[0];
	}
	else
	{
		pDependencies = DE_NULL;
	}
}